

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::
GenerateNewReflectiveBlockingServiceMethod(ImmutableServiceGenerator *this,Printer *printer)

{
  ImmutableServiceGenerator *in_RSI;
  Printer *in_RDI;
  char *in_stack_00000038;
  Printer *in_stack_00000040;
  Printer *in_stack_00000050;
  Printer *in_stack_00000140;
  RequestOrResponse in_stack_0000014c;
  ImmutableServiceGenerator *in_stack_00000150;
  Printer *in_stack_00000208;
  ImmutableServiceGenerator *in_stack_00000210;
  
  io::Printer::Print<>(in_stack_00000040,in_stack_00000038);
  io::Printer::Indent((Printer *)0x54bac2);
  io::Printer::Indent((Printer *)0x54bacc);
  GenerateGetDescriptorForType(in_RSI,in_RDI);
  GenerateCallBlockingMethod(in_stack_00000210,in_stack_00000208);
  GenerateGetPrototype(in_stack_00000150,in_stack_0000014c,in_stack_00000140);
  GenerateGetPrototype(in_stack_00000150,in_stack_0000014c,in_stack_00000140);
  io::Printer::Outdent(in_stack_00000050);
  io::Printer::Print<>(in_stack_00000040,in_stack_00000038);
  io::Printer::Outdent(in_stack_00000050);
  io::Printer::Print<>(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateNewReflectiveBlockingServiceMethod(
    io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.BlockingService\n"
      "    newReflectiveBlockingService(final BlockingInterface impl) {\n"
      "  return new com.google.protobuf.BlockingService() {\n");
  printer->Indent();
  printer->Indent();

  GenerateGetDescriptorForType(printer);

  GenerateCallBlockingMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);

  printer->Outdent();
  printer->Print("};\n");
  printer->Outdent();
  printer->Print("}\n\n");
}